

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O2

int OPENSSL_tm_to_posix(tm *tm,int64_t *out)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  short sVar7;
  short sVar8;
  uint uVar9;
  long lVar10;
  
  uVar1 = (long)tm->tm_year + 0x76c;
  if (9999 < uVar1) {
    return 0;
  }
  uVar9 = tm->tm_mon;
  if (((-1 < (int)uVar9) && (uVar2 = tm->tm_mday, 0 < (int)uVar2)) && (uVar9 < 0xc)) {
    uVar3 = tm->tm_hour;
    uVar4 = tm->tm_min;
    uVar5 = tm->tm_sec;
    if ((0xad5U >> (uVar9 & 0x1f) & 1) == 0) {
      if ((0x528U >> (uVar9 & 0x1f) & 1) == 0) {
        if (((ushort)((ushort)uVar1 % 400) == 0) ||
           (((long)tm->tm_year & 3U) == 0 && (ushort)((ushort)uVar1 % 100) != 0)) {
          if (0x1d < uVar2) {
            return 0;
          }
        }
        else if (0x1c < uVar2) {
          return 0;
        }
      }
      else if (0x1e < uVar2) {
        return 0;
      }
    }
    else if (0x1f < uVar2) {
      return 0;
    }
    if ((((int)uVar5 < 0x3c) && ((int)uVar4 < 0x3c)) && ((int)uVar3 < 0x18)) {
      if (-1 < (int)(uVar4 | uVar3 | uVar5)) {
        lVar10 = uVar1 - ((long)(int)uVar9 + 1U < 3);
        iVar6 = uVar9 + 0xfffe;
        if ((long)(int)uVar9 + 1U < 3) {
          iVar6 = uVar9 + 10;
        }
        sVar8 = (short)lVar10 + -399;
        if (-1 < lVar10) {
          sVar8 = (short)lVar10;
        }
        lVar10 = (long)(sVar8 / 400) * -400 + lVar10;
        uVar9 = iVar6 * 0x99 + 2;
        sVar7 = (short)lVar10;
        *out = (long)(int)uVar4 * 0x3c + (long)(int)uVar3 * 0xe10 + (long)(int)uVar5 + -0xe79256200
               + ((ulong)(uVar2 - 1) +
                  (long)(short)((int)((uint)(ushort)((short)uVar9 >> 0xf) << 0x10 | uVar9 & 0xffff)
                               / 5) + (long)(sVar8 / 400) * 0x23ab1 + lVar10 * 0x16d +
                  (long)(sVar7 / 4) + (long)(sVar7 / -100)) * 0x15180;
        return 1;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int OPENSSL_tm_to_posix(const struct tm *tm, int64_t *out) {
  return posix_time_from_utc(tm->tm_year + INT64_C(1900),
                             tm->tm_mon + INT64_C(1), tm->tm_mday, tm->tm_hour,
                             tm->tm_min, tm->tm_sec, out);
}